

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O1

ngx_int_t ngx_decode_base64_internal(ngx_str_t *dst,ngx_str_t *src,u_char *basis)

{
  ulong uVar1;
  ngx_int_t nVar2;
  byte *pbVar3;
  ulong uVar4;
  ulong uVar5;
  byte *pbVar6;
  
  uVar1 = src->len;
  if (uVar1 == 0) {
    uVar5 = 0;
  }
  else {
    uVar4 = 0;
    do {
      uVar5 = uVar4;
      if ((ulong)src->data[uVar4] == 0x3d) break;
      if (basis[src->data[uVar4]] == 'M') {
        return -1;
      }
      uVar4 = uVar4 + 1;
      uVar5 = uVar1;
    } while (uVar1 != uVar4);
  }
  nVar2 = -1;
  if (((uint)uVar5 & 3) != 1) {
    pbVar6 = src->data;
    pbVar3 = dst->data;
    for (; 3 < uVar5; uVar5 = uVar5 - 4) {
      *pbVar3 = basis[pbVar6[1]] >> 4 | basis[*pbVar6] << 2;
      pbVar3[1] = basis[pbVar6[2]] >> 2 | basis[pbVar6[1]] << 4;
      pbVar3[2] = basis[pbVar6[2]] << 6 | basis[pbVar6[3]];
      pbVar3 = pbVar3 + 3;
      pbVar6 = pbVar6 + 4;
    }
    if (1 < uVar5) {
      *pbVar3 = basis[pbVar6[1]] >> 4 | basis[*pbVar6] << 2;
      pbVar3 = pbVar3 + 1;
    }
    if (uVar5 == 3) {
      *pbVar3 = basis[pbVar6[2]] >> 2 | basis[pbVar6[1]] << 4;
      pbVar3 = pbVar3 + 1;
    }
    dst->len = (long)pbVar3 - (long)dst->data;
    nVar2 = 0;
  }
  return nVar2;
}

Assistant:

static ngx_int_t
ngx_decode_base64_internal(ngx_str_t *dst, ngx_str_t *src, const u_char *basis)
{
    size_t          len;
    u_char         *d, *s;

    for (len = 0; len < src->len; len++) {
        if (src->data[len] == '=') {
            break;
        }

        if (basis[src->data[len]] == 77) {
            return NGX_ERROR;
        }
    }

    if (len % 4 == 1) {
        return NGX_ERROR;
    }

    s = src->data;
    d = dst->data;

    while (len > 3) {
        *d++ = (u_char) (basis[s[0]] << 2 | basis[s[1]] >> 4);
        *d++ = (u_char) (basis[s[1]] << 4 | basis[s[2]] >> 2);
        *d++ = (u_char) (basis[s[2]] << 6 | basis[s[3]]);

        s += 4;
        len -= 4;
    }

    if (len > 1) {
        *d++ = (u_char) (basis[s[0]] << 2 | basis[s[1]] >> 4);
    }

    if (len > 2) {
        *d++ = (u_char) (basis[s[1]] << 4 | basis[s[2]] >> 2);
    }

    dst->len = d - dst->data;

    return NGX_OK;
}